

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O2

string * probeChannel_abi_cxx11_(string *__return_storage_ptr__,Device *device,int dir,size_t chan)

{
  string *psVar1;
  char cVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  size_t i;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  string sensors;
  string corrections;
  string freqArgs;
  string settings;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  correctionsList;
  string antennas;
  RangeList bws;
  string native;
  double fullScale;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  freqsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gainsList;
  string streamArgs;
  string formats;
  Kwargs info;
  string dirName;
  stringstream ss;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  string local_358;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  string local_2f8;
  string *local_2d8;
  long local_2d0;
  long local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  double local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  ArgInfoList local_260 [24];
  string local_248;
  string local_228;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pcVar5 = "RX";
  if (dir == 0) {
    pcVar5 = "TX";
  }
  std::__cxx11::string::string(local_1d8,pcVar5,(allocator *)&local_208);
  std::endl<char,std::char_traits<char>>(local_1a8);
  poVar3 = std::operator<<(local_1a8,"----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(local_1a8,"-- ");
  poVar3 = std::operator<<(poVar3,local_1d8);
  poVar3 = std::operator<<(poVar3," Channel ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(local_1a8,"----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  (**(code **)(*(long *)device + 0x40))(&local_208,device,dir,chan);
  if (local_208._M_impl.super__Rb_tree_header._M_node_count != 0) {
    poVar3 = std::operator<<(local_1a8,"  Channel Information:");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (p_Var4 = local_208._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &local_208._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      poVar3 = std::operator<<(local_1a8,"    ");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 1));
      poVar3 = std::operator<<(poVar3,"=");
      poVar3 = std::operator<<(poVar3,(string *)(p_Var4 + 2));
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  poVar3 = std::operator<<(local_1a8,"  Full-duplex: ");
  cVar2 = (**(code **)(*(long *)device + 0x48))(device,dir,chan);
  pcVar5 = "NO";
  pcVar6 = "NO";
  if (cVar2 != '\0') {
    pcVar6 = "YES";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(local_1a8,"  Supports AGC: ");
  cVar2 = (**(code **)(*(long *)device + 0x158))(device,dir,chan);
  if (cVar2 != '\0') {
    pcVar5 = "YES";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  (**(code **)(*(long *)device + 0x50))(&local_2b8,device,dir,chan);
  toString<std::__cxx11::string>(&local_228,&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  if (local_228._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Stream formats: ");
    poVar3 = std::operator<<(poVar3,(string *)&local_228);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_298 = 0.0;
  (**(code **)(*(long *)device + 0x58))(&local_2b8,device,dir,chan);
  poVar3 = std::operator<<(local_1a8,"  Native format: ");
  poVar3 = std::operator<<(poVar3,(string *)&local_2b8);
  std::operator<<(poVar3," [full-scale=");
  poVar3 = std::ostream::_M_insert<double>(local_298);
  poVar3 = std::operator<<(poVar3,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  (**(code **)(*(long *)device + 0x60))(&local_2f8,device,dir,chan);
  toString_abi_cxx11_(&local_248,(ArgInfoList *)&local_2f8);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)&local_2f8);
  if (local_248._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Stream args:");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(poVar3,(string *)&local_248);
  }
  (**(code **)(*(long *)device + 0xd8))(&local_378,device,dir,chan);
  toString<std::__cxx11::string>
            (&local_2f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_378);
  if (local_2f8._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Antennas: ");
    poVar3 = std::operator<<(poVar3,(string *)&local_2f8);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar2 = (**(code **)(*(long *)device + 0xf0))(device,dir,chan);
  if (cVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_378,"DC removal",(allocator *)&local_358);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               &local_378);
    std::__cxx11::string::~string((string *)&local_378);
  }
  cVar2 = (**(code **)(*(long *)device + 0x108))(device,dir,chan);
  if (cVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_378,"DC offset",(allocator *)&local_358);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               &local_378);
    std::__cxx11::string::~string((string *)&local_378);
  }
  cVar2 = (**(code **)(*(long *)device + 0x120))(device,dir,chan);
  if (cVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_378,"IQ balance",(allocator *)&local_358);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_318,
               &local_378);
    std::__cxx11::string::~string((string *)&local_378);
  }
  toString<std::__cxx11::string>(&local_378,&local_318);
  if (local_378._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Corrections: ");
    poVar3 = std::operator<<(poVar3,(string *)&local_378);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<(local_1a8,"  Full gain range: ");
  (**(code **)(*(long *)device + 400))(&local_398,device,dir,chan);
  toString_abi_cxx11_(&local_358,(Range *)&local_398);
  poVar3 = std::operator<<(poVar3,(string *)&local_358);
  poVar3 = std::operator<<(poVar3," dB");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_2d8 = __return_storage_ptr__;
  std::__cxx11::string::~string((string *)&local_358);
  (**(code **)(*(long *)device + 0x150))(&local_278,device,dir,chan);
  lVar8 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_278.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_278.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    std::__cxx11::string::string
              ((string *)&local_358,
               (string *)
               ((long)&((local_278.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
    poVar3 = std::operator<<(local_1a8,"    ");
    poVar3 = std::operator<<(poVar3,(string *)&local_358);
    poVar3 = std::operator<<(poVar3," gain range: ");
    (**(code **)(*(long *)device + 0x198))(&local_338,device,dir,chan,&local_358);
    toString_abi_cxx11_(&local_398,(Range *)&local_338);
    poVar3 = std::operator<<(poVar3,(string *)&local_398);
    poVar3 = std::operator<<(poVar3," dB");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_358);
    lVar8 = lVar8 + 0x20;
  }
  poVar3 = std::operator<<(local_1a8,"  Full freq range: ");
  (**(code **)(*(long *)device + 0x1c8))(&local_398,device,dir,chan);
  toString_abi_cxx11_(&local_358,(RangeList *)&local_398,1000000.0);
  poVar3 = std::operator<<(poVar3,(string *)&local_358);
  poVar3 = std::operator<<(poVar3," MHz");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_358);
  std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base
            ((_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)&local_398);
  (**(code **)(*(long *)device + 0x1c0))(&local_290,device,dir,chan);
  lVar8 = 0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)local_290.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_290.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
    std::__cxx11::string::string
              ((string *)&local_358,
               (string *)
               ((long)&((local_290.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8));
    poVar3 = std::operator<<(local_1a8,"    ");
    poVar3 = std::operator<<(poVar3,(string *)&local_358);
    poVar3 = std::operator<<(poVar3," freq range: ");
    (**(code **)(*(long *)device + 0x1d0))(&local_338,device,dir,chan,&local_358);
    toString_abi_cxx11_(&local_398,(RangeList *)&local_338,1000000.0);
    poVar3 = std::operator<<(poVar3,(string *)&local_398);
    poVar3 = std::operator<<(poVar3," MHz");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_398);
    std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base
              ((_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)&local_338);
    std::__cxx11::string::~string((string *)&local_358);
    lVar8 = lVar8 + 0x20;
  }
  (**(code **)(*(long *)device + 0x1d8))(&local_398,device,dir,chan);
  toString_abi_cxx11_(&local_358,(ArgInfoList *)&local_398);
  psVar1 = local_2d8;
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)&local_398);
  if (local_358._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Tune args:");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(poVar3,(string *)&local_358);
  }
  poVar3 = std::operator<<(local_1a8,"  Sample rates: ");
  (**(code **)(*(long *)device + 0x1f8))(&local_338,device,dir,chan);
  toString_abi_cxx11_(&local_398,(RangeList *)&local_338,1000000.0);
  poVar3 = std::operator<<(poVar3,(string *)&local_398);
  poVar3 = std::operator<<(poVar3," MSps");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_398);
  std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base
            ((_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)&local_338);
  (**(code **)(*(long *)device + 0x218))(&local_2d0,device,dir,chan);
  if (local_2d0 != local_2c8) {
    poVar3 = std::operator<<(local_1a8,"  Filter bandwidths: ");
    toString_abi_cxx11_(&local_398,(RangeList *)&local_2d0,1000000.0);
    poVar3 = std::operator<<(poVar3,(string *)&local_398);
    poVar3 = std::operator<<(poVar3," MHz");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::__cxx11::string::~string((string *)&local_398);
  }
  (**(code **)(*(long *)device + 0x2a0))(&local_338,device,dir,chan);
  toString<std::__cxx11::string>
            (&local_398,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_338);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_338);
  if (local_398._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Sensors: ");
    poVar3 = std::operator<<(poVar3,(string *)&local_398);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  (**(code **)(*(long *)device + 0x308))(local_260,device,dir,chan);
  toString_abi_cxx11_(&local_338,local_260);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector(local_260);
  if (local_338._M_string_length != 0) {
    poVar3 = std::operator<<(local_1a8,"  Other Settings:");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<(poVar3,(string *)&local_338);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_398);
  std::_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::~_Vector_base
            ((_Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_> *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_290);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_278);
  std::__cxx11::string::~string((string *)&local_378);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_228);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_208);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

static std::string probeChannel(SoapySDR::Device *device, const int dir, const size_t chan)
{
    std::stringstream ss;

    std::string dirName = (dir==SOAPY_SDR_TX)?"TX":"RX";
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- " << dirName << " Channel " << chan << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    // info
    const auto info = device->getChannelInfo(dir, chan);
    if (info.size() > 0)
    {
        ss << "  Channel Information:" << std::endl;
        for (const auto &it : info)
        {
            ss << "    " << it.first << "=" << it.second << std::endl;
        }
    }

    ss << "  Full-duplex: " << (device->getFullDuplex(dir, chan)?"YES":"NO") << std::endl;
    ss << "  Supports AGC: " << (device->hasGainMode(dir, chan)?"YES":"NO") << std::endl;

    //formats
    std::string formats = toString(device->getStreamFormats(dir, chan));
    if (not formats.empty()) ss << "  Stream formats: " << formats << std::endl;

    //native
    double fullScale = 0.0;
    std::string native = device->getNativeStreamFormat(dir, chan, fullScale);
    ss << "  Native format: " << native << " [full-scale=" << fullScale << "]" << std::endl;    

    //stream args
    std::string streamArgs = toString(device->getStreamArgsInfo(dir, chan));
    if (not streamArgs.empty()) ss << "  Stream args:" << std::endl << streamArgs;

    //antennas
    std::string antennas = toString(device->listAntennas(dir, chan));
    if (not antennas.empty()) ss << "  Antennas: " << antennas << std::endl;

    //corrections
    std::vector<std::string> correctionsList;
    if (device->hasDCOffsetMode(dir, chan)) correctionsList.push_back("DC removal");
    if (device->hasDCOffset(dir, chan)) correctionsList.push_back("DC offset");
    if (device->hasIQBalance(dir, chan)) correctionsList.push_back("IQ balance");
    std::string corrections = toString(correctionsList);
    if (not corrections.empty()) ss << "  Corrections: " << corrections << std::endl;

    //gains
    ss << "  Full gain range: " << toString(device->getGainRange(dir, chan)) << " dB" << std::endl;
    std::vector<std::string> gainsList = device->listGains(dir, chan);
    for (size_t i = 0; i < gainsList.size(); i++)
    {
        const std::string name = gainsList[i];
        ss << "    " << name << " gain range: " << toString(device->getGainRange(dir, chan, name)) << " dB" << std::endl;
    }

    //frequencies
    ss << "  Full freq range: " << toString(device->getFrequencyRange(dir, chan), 1e6) << " MHz" << std::endl;
    std::vector<std::string> freqsList = device->listFrequencies(dir, chan);
    for (size_t i = 0; i < freqsList.size(); i++)
    {
        const std::string name = freqsList[i];
        ss << "    " << name << " freq range: " << toString(device->getFrequencyRange(dir, chan, name), 1e6) << " MHz" << std::endl;
    }

    //freq args
    std::string freqArgs = toString(device->getFrequencyArgsInfo(dir, chan));
    if (not freqArgs.empty()) ss << "  Tune args:" << std::endl << freqArgs;

    //rates
    ss << "  Sample rates: " << toString(device->getSampleRateRange(dir, chan), 1e6) << " MSps" << std::endl;

    //bandwidths
    const auto bws = device->getBandwidthRange(dir, chan);
    if (not bws.empty()) ss << "  Filter bandwidths: " << toString(bws, 1e6) << " MHz" << std::endl;

    //sensors
    std::string sensors = toString(device->listSensors(dir, chan));
    if (not sensors.empty()) ss << "  Sensors: " << sensors << std::endl;

    //settings
    std::string settings = toString(device->getSettingInfo(dir, chan));
    if (not settings.empty()) ss << "  Other Settings:" << std::endl << settings;

    return ss.str();
}